

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  unsigned_long uVar4;
  char *pcVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong dindex;
  Directory d;
  string path;
  string ppath;
  string fname;
  string sfname;
  allocator local_f1;
  Directory local_f0;
  undefined8 local_e8;
  int local_dc;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_dc = type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_d8,glob);
    cmsys::SystemTools::GetFilenameName(&local_b0,glob);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_d8._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_d8);
    }
    cmsys::Directory::Directory(&local_f0);
    bVar1 = cmsys::Directory::Load(&local_f0,&local_d8);
    uVar7 = 0;
    local_e8 = 0;
    if (bVar1) {
      local_e8 = 0;
      local_b8 = files;
      while( true ) {
        uVar4 = cmsys::Directory::GetNumberOfFiles(&local_f0);
        dindex = (ulong)uVar7;
        if (uVar4 <= dindex) break;
        pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
        std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_50);
        bVar1 = std::operator!=(&local_90,".");
        if (bVar1) {
          pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
          std::__cxx11::string::string((string *)&local_70,pcVar5,&local_f1);
          bVar1 = std::operator!=(&local_70,"..");
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_90,(string *)&local_d8);
            if (local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] != '/') {
              std::__cxx11::string::append((char *)&local_90);
            }
            cmsys::Directory::GetFile(&local_f0,dindex);
            std::__cxx11::string::append((char *)&local_90);
            pcVar5 = cmsys::Directory::GetFile(&local_f0,dindex);
            std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
            if (local_dc < 1) {
              if ((-1 < local_dc) || (bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90), bVar1)
                 ) goto LAB_0031089f;
            }
            else {
              bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90);
              if (!bVar1) {
LAB_0031089f:
                if (local_b0._M_string_length <= local_70._M_string_length) {
                  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
                  _Var2 = std::operator==(&local_50,&local_b0);
                  uVar6 = std::__cxx11::string::~string((string *)&local_50);
                  if (_Var2) {
                    local_e8 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(local_b8,&local_90);
                  }
                }
              }
            }
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_003108f4;
          }
        }
        else {
LAB_003108f4:
          std::__cxx11::string::~string((string *)&local_90);
        }
        uVar7 = uVar7 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar3 = (byte)local_e8;
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob[glob.size() - 1] != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path[path.size() - 1] != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (sfname.size() >= ppath.size() &&
            sfname.substr(0, ppath.size()) == ppath) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}